

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

QLayoutItem * __thiscall QToolBarAreaLayout::takeAt(QToolBarAreaLayout *this,int *x,int index)

{
  int iVar1;
  long lVar2;
  pointer pQVar3;
  long lVar4;
  long lVar5;
  QToolBarAreaLayoutInfo *this_00;
  ulong i;
  long in_FS_OFFSET;
  QToolBarAreaLayoutItem local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = 0;
  do {
    if (lVar4 == 4) {
      local_50.widgetItem = (QLayoutItem *)0x0;
LAB_0046f62a:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return local_50.widgetItem;
      }
      __stack_chk_fail();
    }
    this_00 = this->docks + lVar4;
    for (i = 0; i < (ulong)(this_00->lines).d.size; i = i + 1) {
      pQVar3 = QList<QToolBarAreaLayoutLine>::data(&this_00->lines);
      lVar2 = pQVar3[i].toolBarItems.d.size;
      lVar5 = 1;
      while (lVar2 + lVar5 != 1) {
        iVar1 = *x;
        *x = iVar1 + 1;
        lVar5 = lVar5 + -1;
        if (iVar1 == index) {
          QList<QToolBarAreaLayoutItem>::takeAt(&local_50,&pQVar3[i].toolBarItems,-lVar5);
          if (pQVar3[i].toolBarItems.d.size == 0) {
            QList<QToolBarAreaLayoutLine>::removeAt(&this_00->lines,i);
          }
          goto LAB_0046f62a;
        }
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

QLayoutItem *QToolBarAreaLayout::takeAt(int *x, int index)
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            QToolBarAreaLayoutLine &line = dock.lines[j];

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if ((*x)++ == index) {
                    QLayoutItem *result = line.toolBarItems.takeAt(k).widgetItem;
                    if (line.toolBarItems.isEmpty())
                        dock.lines.removeAt(j);
                    return result;
                }
            }
        }
    }

    return nullptr;
}